

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_FailableMemoryAllocator_CheckAllFailingLocationAllocsWereDone_TestShell::createTest
          (TEST_FailableMemoryAllocator_CheckAllFailingLocationAllocsWereDone_TestShell *this)

{
  TEST_FailableMemoryAllocator_CheckAllFailingLocationAllocsWereDone_Test *this_00;
  TEST_FailableMemoryAllocator_CheckAllFailingLocationAllocsWereDone_TestShell *this_local;
  
  this_00 = (TEST_FailableMemoryAllocator_CheckAllFailingLocationAllocsWereDone_Test *)
            operator_new(0x70,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
                         ,0x13b);
  TEST_FailableMemoryAllocator_CheckAllFailingLocationAllocsWereDone_Test::
  TEST_FailableMemoryAllocator_CheckAllFailingLocationAllocsWereDone_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(FailableMemoryAllocator, CheckAllFailingLocationAllocsWereDone)
{
    testFunction.testFunction_ = failingLocationAllocIsNeverDone_;

    fixture.runAllTests();

    LONGS_EQUAL(1, fixture.getFailureCount());
    fixture.assertPrintContains("Expected failing alloc at TestMemoryAllocatorTest.cpp:");
    fixture.assertPrintContains("was never done");

    failableMallocAllocator->clearFailedAllocs();
}